

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

void Abc_NtkTestMiniMapping(Abc_Ntk_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *pArray;
  Vec_Int_t *vMapping;
  Abc_Ntk_t *p_local;
  
  p_00 = Abc_NtkWriteMiniMapping(p);
  pArray = Vec_IntArray(p_00);
  Abc_NtkPrintMiniMapping(pArray);
  uVar1 = Vec_IntSize(p_00);
  printf("Array has size %d ints.\n",(ulong)uVar1);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_NtkTestMiniMapping( Abc_Ntk_t * p )
{
    Vec_Int_t * vMapping;
    vMapping = Abc_NtkWriteMiniMapping( p );
    Abc_NtkPrintMiniMapping( Vec_IntArray(vMapping) );
    printf( "Array has size %d ints.\n", Vec_IntSize(vMapping) );
    Vec_IntFree( vMapping );
}